

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O1

void btSoftBody::solveClusters(btAlignedObjectArray<btSoftBody_*> *bodies)

{
  int iVar1;
  uint uVar2;
  btSoftBody *pbVar3;
  Joint *pJVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  
  iVar1 = bodies->m_size;
  lVar11 = (long)iVar1;
  if (lVar11 < 1) {
    uVar9 = 0;
  }
  else {
    lVar6 = 0;
    uVar7 = 0;
    do {
      uVar2 = (bodies->m_data[lVar6]->m_cfg).citerations;
      if ((int)uVar2 < (int)uVar7) {
        uVar2 = uVar7;
      }
      uVar7 = uVar2;
      uVar9 = (ulong)uVar7;
      lVar6 = lVar6 + 1;
    } while (lVar11 != lVar6);
  }
  if (0 < iVar1) {
    lVar6 = 0;
    do {
      pbVar3 = bodies->m_data[lVar6];
      if (0 < (pbVar3->m_joints).m_size) {
        lVar10 = 0;
        do {
          pJVar4 = (pbVar3->m_joints).m_data[lVar10];
          (*pJVar4->_vptr_Joint[2])((pbVar3->m_sst).sdt,pJVar4,uVar9);
          lVar10 = lVar10 + 1;
        } while (lVar10 < (pbVar3->m_joints).m_size);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar11);
  }
  if (0 < (int)uVar9) {
    iVar5 = 0;
    do {
      if (0 < iVar1) {
        lVar6 = 0;
        do {
          pbVar3 = bodies->m_data[lVar6];
          lVar10 = (long)(pbVar3->m_joints).m_size;
          if (0 < lVar10) {
            lVar8 = 0;
            do {
              (*(pbVar3->m_joints).m_data[lVar8]->_vptr_Joint[3])((pbVar3->m_sst).sdt,0x3f800000);
              lVar8 = lVar8 + 1;
            } while (lVar10 != lVar8);
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != lVar11);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != (int)uVar9);
  }
  if (0 < iVar1) {
    lVar6 = 0;
    do {
      cleanupClusters(bodies->m_data[lVar6]);
      lVar6 = lVar6 + 1;
    } while (lVar11 != lVar6);
  }
  return;
}

Assistant:

void			btSoftBody::solveClusters(const btAlignedObjectArray<btSoftBody*>& bodies)
{
	const int	nb=bodies.size();
	int			iterations=0;
	int i;

	for(i=0;i<nb;++i)
	{
		iterations=btMax(iterations,bodies[i]->m_cfg.citerations);
	}
	for(i=0;i<nb;++i)
	{
		bodies[i]->prepareClusters(iterations);
	}
	for(i=0;i<iterations;++i)
	{
		const btScalar sor=1;
		for(int j=0;j<nb;++j)
		{
			bodies[j]->solveClusters(sor);
		}
	}
	for(i=0;i<nb;++i)
	{
		bodies[i]->cleanupClusters();
	}
}